

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

Maybe<capnp::compiler::NodeTranslator::BrandedDecl_&> __thiscall
capnp::compiler::NodeTranslator::BrandedDecl::getListParam(BrandedDecl *this)

{
  bool bVar1;
  ResolvedDecl *pRVar2;
  BrandScope *this_00;
  NullableValue<kj::ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl>_> *pNVar3;
  ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl> *pAVar4;
  size_t sVar5;
  BrandedDecl *t;
  Fault local_a0;
  Maybe<kj::ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl>_> local_98;
  undefined1 local_80 [8];
  NullableValue<kj::ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl>_> _kj_result;
  undefined1 local_50 [8];
  ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl> params;
  Fault f_1;
  ResolvedDecl *decl;
  Fault local_20;
  Fault f;
  BrandedDecl *this_local;
  
  f.exception = (Exception *)this;
  bVar1 = kj::
          OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
          ::is<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>(&this->body);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0x396,FAILED,"body.is<Resolver::ResolvedDecl>()","");
    kj::_::Debug::Fault::fatal(&local_20);
  }
  pRVar2 = kj::
           OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
           ::get<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>(&this->body);
  if (pRVar2->kind == BUILTIN_LIST) {
    this_00 = kj::Own<capnp::compiler::NodeTranslator::BrandScope>::operator->(&this->brand);
    BrandScope::getParams(&local_98,this_00,pRVar2->id);
    pNVar3 = kj::_::readMaybe<kj::ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl>>(&local_98)
    ;
    kj::_::NullableValue<kj::ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl>_>::NullableValue
              ((NullableValue<kj::ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl>_> *)
               local_80,pNVar3);
    kj::Maybe<kj::ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl>_>::~Maybe(&local_98);
    pAVar4 = kj::_::NullableValue::operator_cast_to_ArrayPtr_((NullableValue *)local_80);
    if (pAVar4 != (ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl> *)0x0) {
      pNVar3 = kj::
               mv<kj::_::NullableValue<kj::ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl>>>
                         ((NullableValue<kj::ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl>_>
                           *)local_80);
      kj::_::NullableValue<kj::ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl>_>::
      NullableValue((NullableValue<kj::ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl>_> *)
                    ((long)&_kj_result.field_1 + 8),pNVar3);
      kj::_::NullableValue<kj::ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl>_>::
      ~NullableValue((NullableValue<kj::ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl>_> *)
                     local_80);
      pAVar4 = kj::_::NullableValue<kj::ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl>_>::
               operator*((NullableValue<kj::ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl>_>
                          *)((long)&_kj_result.field_1 + 8));
      local_50 = (undefined1  [8])pAVar4->ptr;
      params.ptr = (BrandedDecl *)pAVar4->size_;
      kj::_::NullableValue<kj::ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl>_>::
      ~NullableValue((NullableValue<kj::ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl>_> *)
                     ((long)&_kj_result.field_1 + 8));
      sVar5 = kj::ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl>::size
                        ((ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl> *)local_50);
      if (sVar5 == 1) {
        t = kj::ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl>::operator[]
                      ((ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl> *)local_50,0);
        kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl_&>::Maybe
                  ((Maybe<capnp::compiler::NodeTranslator::BrandedDecl_&> *)&this_local,t);
      }
      else {
        kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl_&>::Maybe
                  ((Maybe<capnp::compiler::NodeTranslator::BrandedDecl_&> *)&this_local,(void *)0x0)
        ;
      }
      return (Maybe<capnp::compiler::NodeTranslator::BrandedDecl_&>)this_local;
    }
    kj::_::Debug::Fault::Fault
              (&local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0x39b,FAILED,"brand->getParams(decl.id) != nullptr","");
    kj::_::Debug::Fault::fatal(&local_a0);
  }
  kj::_::Debug::Fault::Fault
            ((Fault *)&params.size_,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
             ,0x399,FAILED,"decl.kind == Declaration::BUILTIN_LIST","");
  kj::_::Debug::Fault::fatal((Fault *)&params.size_);
}

Assistant:

kj::Maybe<NodeTranslator::BrandedDecl&> NodeTranslator::BrandedDecl::getListParam() {
  KJ_REQUIRE(body.is<Resolver::ResolvedDecl>());

  auto& decl = body.get<Resolver::ResolvedDecl>();
  KJ_REQUIRE(decl.kind == Declaration::BUILTIN_LIST);

  auto params = KJ_ASSERT_NONNULL(brand->getParams(decl.id));
  if (params.size() != 1) {
    return nullptr;
  } else {
    return params[0];
  }
}